

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void chaiscript::detail::Dispatch_Engine::save_function_params
               (Stack_Holder *t_s,
               vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_params)

{
  pointer pBVar1;
  pointer pvVar2;
  Boxed_Value *param;
  pointer __v;
  
  pBVar1 = (t_params->
           super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (__v = (t_params->
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
             _M_impl.super__Vector_impl_data._M_start; __v != pBVar1; __v = __v + 1) {
    pvVar2 = (t_s->call_params).
             super__Vector_base<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::_M_insert_rval
              (pvVar2 + -1,
               pvVar2[-1].
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_start,__v);
  }
  return;
}

Assistant:

static void save_function_params(Stack_Holder &t_s, std::vector<Boxed_Value> &&t_params) {
        for (auto &&param : t_params) {
          t_s.call_params.back().insert(t_s.call_params.back().begin(), std::move(param));
        }
      }